

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::popcntI8x16(Literal *__return_storage_ptr__,Literal *this)

{
  Type *__return_storage_ptr___00;
  Literal *in_RDX;
  long lVar1;
  Literal *this_00;
  undefined1 local_1c0 [8];
  LaneArray<16> lanes;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)local_1c0,(wasm *)this,in_RDX);
  lVar1 = 0;
  __return_storage_ptr___00 = &lanes._M_elems[0xf].type;
  do {
    this_00 = (Literal *)(local_1c0 + lVar1);
    popCount((Literal *)__return_storage_ptr___00,this_00);
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x180);
  Literal(__return_storage_ptr__,(LaneArray<16> *)local_1c0);
  lVar1 = 0x168;
  do {
    ~Literal((Literal *)(local_1c0 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::popcntI8x16() const {
  return unary<16, &Literal::getLanesUI8x16, &Literal::popCount>(*this);
}